

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

qsizetype QtPrivate::indexOf<QString,QAnyStringView>
                    (QList<QString> *vector,QAnyStringView *u,qsizetype from)

{
  ulong uVar1;
  QString *pQVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  qsizetype *pqVar7;
  long lVar8;
  QAnyStringView QVar9;
  
  if (from < 0) {
    from = from + (vector->d).size;
    if (from < 1) {
      from = 0;
    }
  }
  uVar1 = (vector->d).size;
  if ((ulong)from < uVar1) {
    pQVar2 = (vector->d).ptr;
    pqVar7 = &pQVar2[from].d.size;
    lVar5 = uVar1 * 8;
    lVar3 = uVar1 * 0x18 + from * -0x18;
    lVar4 = 0x18 - (long)(pQVar2 + from);
    do {
      lVar8 = lVar4;
      lVar6 = lVar3;
      if (lVar6 == 0) goto LAB_001d0b85;
      QVar9.m_size = *pqVar7 | 0x8000000000000000;
      QVar9.field_0.m_data = ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)(pqVar7 + -1))->m_data
      ;
      lVar5 = QAnyStringView::equal(QVar9,*u);
      pqVar7 = pqVar7 + 3;
      lVar3 = lVar6 + -0x18;
      lVar4 = lVar8 + -0x18;
    } while ((char)lVar5 == '\0');
    lVar5 = (-((long)&(vector->d).ptr[-1].d.d + lVar8) >> 3) * -0x5555555555555555;
LAB_001d0b85:
    if (lVar6 != 0) {
      return lVar5;
    }
  }
  return -1;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}